

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O2

TToken * __thiscall
tcpp::Lexer::_getNextTokenInternal(TToken *__return_storage_ptr__,Lexer *this,bool ignoreQueue)

{
  _List_node_base *p_Var1;
  long lVar2;
  undefined7 in_register_00000011;
  string sStack_48;
  
  if ((int)CONCAT71(in_register_00000011,ignoreQueue) == 0) {
    p_Var1 = (this->mTokensQueue).super__List_base<tcpp::TToken,_std::allocator<tcpp::TToken>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 != (_List_node_base *)&this->mTokensQueue) {
      TToken::TToken(__return_storage_ptr__,(TToken *)(p_Var1 + 1));
      Catch::clara::std::__cxx11::list<tcpp::TToken,_std::allocator<tcpp::TToken>_>::pop_front
                (&this->mTokensQueue);
      return __return_storage_ptr__;
    }
  }
  if ((this->mCurrLine)._M_string_length == 0) {
    _requestSourceLine_abi_cxx11_(&sStack_48,this);
    lVar2 = std::__cxx11::string::operator=((string *)&this->mCurrLine,(string *)&sStack_48);
    lVar2 = *(long *)(lVar2 + 8);
    std::__cxx11::string::~string((string *)&sStack_48);
    if (lVar2 == 0) {
      TToken::TToken(__return_storage_ptr__,(TToken *)&mEOFToken);
      return __return_storage_ptr__;
    }
  }
  _scanTokens(__return_storage_ptr__,this,&this->mCurrLine);
  return __return_storage_ptr__;
}

Assistant:

TToken Lexer::_getNextTokenInternal(bool ignoreQueue) TCPP_NOEXCEPT
	{
		if (!ignoreQueue && !mTokensQueue.empty())
		{
			auto currToken = mTokensQueue.front();
			mTokensQueue.pop_front();

			return currToken;
		}

		if (mCurrLine.empty())
		{
			// \note if it's still empty then we've reached the end of the source
			if ((mCurrLine = _requestSourceLine()).empty())
			{
				return mEOFToken;
			}
		}

		return _scanTokens(mCurrLine);
	}